

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O2

void __thiscall libDAI::RegionGraph::RecomputeORs(RegionGraph *this,VarSet *ns)

{
  pointer pFVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  size_t alpha;
  ulong uVar4;
  _Self __tmp;
  long lVar5;
  
  lVar5 = 0x20;
  for (uVar4 = 0;
      pFVar1 = (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->_rg)._V1.
                            super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 6);
      uVar4 = uVar4 + 1) {
    bVar2 = VarSet::operator&&((VarSet *)((long)pFVar1 + lVar5 + -0x20),ns);
    if (bVar2) {
      TProb<double>::fill((TProb<double> *)
                          ((long)&(((this->_rg)._V1.
                                    super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->super_Factor)._vs +
                          lVar5),1.0);
    }
    lVar5 = lVar5 + 0x40;
  }
  for (p_Var3 = (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->_fac2OR)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar2 = VarSet::operator&&((VarSet *)
                               ((this->_rg)._V1.
                                super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                               (long)p_Var3[1]._M_parent),ns);
    if (bVar2) {
      TFactor<double>::operator*=
                (&(this->_rg)._V1.
                  super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)p_Var3[1]._M_parent].super_Factor,
                 (this->_fg)._fg._V2.
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *(long *)(p_Var3 + 1));
    }
  }
  return;
}

Assistant:

void RegionGraph::RecomputeORs( const VarSet &ns ) {
        for( size_t alpha = 0; alpha < nr_ORs(); alpha++ )
            if( OR(alpha).vars() && ns )
                OR(alpha).fill( 1.0 );
        for( fac2OR_cit I = _fac2OR.begin(); I != _fac2OR.end(); I++ )
            if( OR( I->second ).vars() && ns )
                OR( I->second ) *= _fg.factor( I->first );
    }